

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

int Abc_GraphBuildState(Vec_Int_t *vState,int e,int x,Vec_Int_t *vEdges,Vec_Int_t *vLife,
                       Vec_Wec_t *vFronts,int *pFront,Vec_Int_t *vStateNew,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int *piVar3;
  uint local_78;
  int First_1;
  int Degree_1;
  int Degree;
  int pEquivs [2];
  int First;
  int Node;
  int n;
  int i;
  int nNodes;
  int *pNodes;
  Vec_Int_t *vFront2;
  Vec_Int_t *vFront;
  Vec_Wec_t *vFronts_local;
  Vec_Int_t *vLife_local;
  Vec_Int_t *vEdges_local;
  int x_local;
  int e_local;
  Vec_Int_t *vState_local;
  
  p = Vec_WecEntry(vFronts,e);
  p_00 = Vec_WecEntry(vFronts,e + 1);
  piVar3 = Vec_IntEntryP(vEdges,e << 1);
  iVar1 = Vec_IntSize(vLife);
  if (piVar3[1] <= *piVar3) {
    __assert_fail("pNodes[0] < pNodes[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPath.c"
                  ,0x17b,
                  "int Abc_GraphBuildState(Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, int *, Vec_Int_t *, int)"
                 );
  }
  if (fVerbose != 0) {
    printf("Edge = %d. Arc = %d.\nCurrent state: ",(ulong)(uint)e,(ulong)(uint)x);
  }
  for (Node = 0; iVar2 = Vec_IntSize(p), Node < iVar2; Node = Node + 1) {
    pEquivs[1] = Vec_IntEntry(p,Node);
    iVar2 = Vec_IntEntry(vState,Node);
    pFront[pEquivs[1]] = iVar2;
    if (fVerbose != 0) {
      printf("%d(%d) ",(ulong)(pFront[pEquivs[1]] & 0xffff),
             (ulong)(uint)(pFront[pEquivs[1]] >> 0x10));
    }
  }
  if (fVerbose != 0) {
    printf("\n");
  }
  for (First = 0; First < 2; First = First + 1) {
    iVar2 = Vec_IntEntry(vLife,piVar3[First] << 1);
    if (iVar2 == e) {
      pFront[piVar3[First]] = piVar3[First];
    }
  }
  if (x != 0) {
    if ((pFront[*piVar3] & 0xffffU) == (pFront[piVar3[1]] & 0xffffU)) {
      return -1;
    }
    for (First = 0; First < 2; First = First + 1) {
      if ((piVar3[First] == 0) || (piVar3[First] == iVar1 / 2 + -1)) {
        if (0 < pFront[piVar3[First]] >> 0x10) {
          return -1;
        }
      }
      else if (1 < pFront[piVar3[First]] >> 0x10) {
        return -1;
      }
      pFront[piVar3[First]] = pFront[piVar3[First]] + 0x10000;
    }
  }
  Degree_1 = pFront[*piVar3] & 0xffff;
  Degree = pFront[piVar3[1]] & 0xffff;
  First = 0;
  do {
    if (1 < First) {
      if (x != 0) {
        local_78 = 0xffffffff;
        for (Node = 0; iVar1 = Vec_IntSize(p_00), Node < iVar1; Node = Node + 1) {
          pEquivs[1] = Vec_IntEntry(p_00,Node);
          if (((pFront[pEquivs[1]] & 0xffffU) == Degree_1) ||
             ((pFront[pEquivs[1]] & 0xffffU) == Degree)) {
            if (local_78 == 0xffffffff) {
              local_78 = pEquivs[1];
            }
            pFront[pEquivs[1]] = pFront[pEquivs[1]] & 0xffff0000U | local_78;
          }
        }
      }
      Vec_IntClear(vStateNew);
      if (fVerbose != 0) {
        printf("Next state: ");
      }
      for (Node = 0; iVar1 = Vec_IntSize(p_00), Node < iVar1; Node = Node + 1) {
        pEquivs[1] = Vec_IntEntry(p_00,Node);
        Vec_IntPush(vStateNew,pFront[pEquivs[1]]);
        if (fVerbose != 0) {
          printf("%d(%d) ",(ulong)(pFront[pEquivs[1]] & 0xffff),
                 (ulong)(uint)(pFront[pEquivs[1]] >> 0x10));
        }
      }
      if (fVerbose != 0) {
        printf("\n\n");
      }
      return 1;
    }
    iVar2 = Vec_IntEntry(vLife,piVar3[First] * 2 + 1);
    if (iVar2 == e) {
      iVar2 = pFront[piVar3[First]] >> 0x10;
      if ((piVar3[First] == 0) || (piVar3[First] == iVar1 / 2 + -1)) {
        if (iVar2 != 1) {
          return -1;
        }
      }
      else if ((iVar2 != 0) && (iVar2 != 2)) {
        return -1;
      }
      pEquivs[0] = -1;
      for (Node = 0; iVar2 = Vec_IntSize(p_00), Node < iVar2; Node = Node + 1) {
        pEquivs[1] = Vec_IntEntry(p_00,Node);
        if (pEquivs[1] == piVar3[First]) {
          __assert_fail("Node != pNodes[n]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilPath.c"
                        ,0x1a0,
                        "int Abc_GraphBuildState(Vec_Int_t *, int, int, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, int *, Vec_Int_t *, int)"
                       );
        }
        if ((pFront[pEquivs[1]] & 0xffffU) == (&Degree_1)[First]) {
          if (pEquivs[0] == -1) {
            pEquivs[0] = pEquivs[1];
          }
          pFront[pEquivs[1]] = pFront[pEquivs[1]] & 0xffff0000U | pEquivs[0];
        }
      }
      if (pEquivs[0] != -1) {
        (&Degree_1)[First] = pEquivs[0];
      }
    }
    First = First + 1;
  } while( true );
}

Assistant:

int Abc_GraphBuildState( Vec_Int_t * vState, int e, int x, Vec_Int_t * vEdges, Vec_Int_t * vLife, Vec_Wec_t * vFronts, int * pFront, Vec_Int_t * vStateNew, int fVerbose )
{
    Vec_Int_t * vFront = Vec_WecEntry( vFronts, e );
    Vec_Int_t * vFront2 = Vec_WecEntry( vFronts, e+1 );
    int * pNodes = Vec_IntEntryP(vEdges, 2*e);
    int nNodes = Vec_IntSize(vLife)/2;
    int i, n, Node, First, pEquivs[2];
    assert( pNodes[0] < pNodes[1] );
    if ( fVerbose ) printf( "Edge = %d. Arc = %d.\nCurrent state: ", e, x );
    Vec_IntForEachEntry( vFront, Node, i )
    {
        pFront[Node] = Vec_IntEntry(vState, i);
        if ( fVerbose ) printf( "%d(%d) ", pFront[Node] & 0xFFFF, pFront[Node] >> 16 );
    }
    if ( fVerbose ) printf( "\n" );
    for ( n = 0; n < 2; n++ )
        if ( Vec_IntEntry(vLife, 2*pNodes[n]) == e ) // first time
            pFront[pNodes[n]] = pNodes[n]; // degree = 0; comp = singleton
    if ( x )
    {
        if ( (pFront[pNodes[0]] & 0xFFFF) == (pFront[pNodes[1]] & 0xFFFF) ) // the same comp
            return -1; // const 0
        for ( n = 0; n < 2; n++ )
        {
            int Degree = pFront[pNodes[n]] >> 16;
            if ( (pNodes[n] == 0 || pNodes[n] == nNodes-1) ? Degree >= 1 : Degree >= 2 )
                return -1; // const 0
            pFront[pNodes[n]] += (1 << 16); // degree++
        }
    }
    // remember equivalence classes
    pEquivs[0] = pFront[pNodes[0]] & 0xFFFF;
    pEquivs[1] = pFront[pNodes[1]] & 0xFFFF;
    // remove some nodes from the frontier
    for ( n = 0; n < 2; n++ )
        if ( Vec_IntEntry(vLife, 2*pNodes[n]+1) == e ) // last time
        {
            int Degree = pFront[pNodes[n]] >> 16;
            if ( (pNodes[n] == 0 || pNodes[n] == nNodes-1) ? Degree != 1 : Degree != 0 && Degree != 2 )
                return -1; // const 0
            // if it is part of the comp, update
            First = -1;
            Vec_IntForEachEntry( vFront2, Node, i )
            {
                assert( Node != pNodes[n] );
                if ( (pFront[Node] & 0xFFFF) == pEquivs[n] )
                {
                    if ( First == -1 )
                        First = Node;
                    pFront[Node] = (pFront[Node] & 0xFFFF0000) | First;
                }
            }
            if ( First != -1 )
                pEquivs[n] = First;
        }
    if ( x )
    {
        // union comp
        int First = -1;
        Vec_IntForEachEntry( vFront2, Node, i )
            if ( (pFront[Node] & 0xFFFF) == pEquivs[0] || (pFront[Node] & 0xFFFF) == pEquivs[1] )
            {
                if ( First == -1 )
                    First = Node;
                pFront[Node] = (pFront[Node] & 0xFFFF0000) | First;
            }
    }
    // create next state
    Vec_IntClear( vStateNew );
    if ( fVerbose ) printf( "Next state: " );
    Vec_IntForEachEntry( vFront2, Node, i )
    {
        Vec_IntPush( vStateNew, pFront[Node] );
        if ( fVerbose ) printf( "%d(%d) ", pFront[Node] & 0xFFFF, pFront[Node] >> 16 );
    }
    if ( fVerbose ) printf( "\n\n" );
    return 1;
}